

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

string * anon_unknown.dwarf_36f840::ToCMakePath(string *__return_storage_ptr__,string *path)

{
  string *path_local;
  string *temp;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCMakePath(const std::string& path)
{
  auto temp = path;
  cmSystemTools::ConvertToUnixSlashes(temp);
  return temp;
}